

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_AmrLevel.cpp
# Opt level: O1

void __thiscall
amrex::AmrLevel::AmrLevel
          (AmrLevel *this,Amr *papa,int lev,Geometry *level_geom,BoxArray *ba,
          DistributionMapping *dm,Real time)

{
  int *piVar1;
  pointer *ppiVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  pointer pIVar4;
  FabFactory<amrex::FArrayBox> *pFVar5;
  pointer pSVar6;
  pointer pSVar7;
  bool bVar8;
  _Head_base<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_false> _Var9;
  int iVar10;
  uint uVar11;
  uint uVar12;
  IndexSpace *pIVar13;
  FabFactory<amrex::FArrayBox> *pFVar14;
  long *plVar15;
  undefined8 *puVar16;
  StateDescriptor *d;
  size_type *psVar17;
  ulong uVar18;
  long *plVar19;
  ulong *puVar20;
  BoxArray *pBVar21;
  pointer piVar22;
  long lVar23;
  uint uVar24;
  uint uVar25;
  ulong uVar26;
  uint uVar27;
  initializer_list<int> __l;
  string __str;
  uint __uval;
  string __str_1;
  RegionTag statedata_index_new_tag;
  RegionTag statedata_index_tag;
  RegionTag statedata_tag;
  string __str_2;
  RegionTag level_tag;
  vector<int,_std::allocator<int>_> local_190;
  long lStack_178;
  AmrLevel *local_170;
  Geometry *local_168;
  pointer *local_160;
  long local_158;
  pointer local_150 [2];
  RegionTag local_13b;
  RegionTag local_13a;
  RegionTag local_139;
  BoxArray *local_138;
  _Head_base<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_false> local_130 [2];
  FabFactory<amrex::FArrayBox> local_120 [2];
  undefined8 local_110;
  long local_108;
  long local_100;
  long lStack_f8;
  string local_f0;
  string local_d0;
  Vector<amrex::StateData,_std::allocator<amrex::StateData>_> *local_b0;
  BoxArray *local_a8;
  long local_a0;
  DistributionMapping *local_98;
  string local_90;
  string local_70;
  BoxArray *local_50;
  BoxArray *local_48;
  Box *local_40;
  Real local_38;
  
  this->_vptr_AmrLevel = (_func_int **)&PTR__AmrLevel_00750b70;
  local_168 = &this->geom;
  local_38 = time;
  memcpy(local_168,level_geom,200);
  local_a8 = &this->grids;
  local_138 = ba;
  BoxArray::BoxArray(local_a8,ba);
  (this->dmap).m_ref.super___shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (dm->m_ref).
            super___shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  p_Var3 = (dm->m_ref).
           super___shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  (this->dmap).m_ref.super___shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = p_Var3;
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
    }
  }
  local_b0 = &this->state;
  local_48 = &this->m_AreaNotToTag;
  (this->state).super_vector<amrex::StateData,_std::allocator<amrex::StateData>_>.
  super__Vector_base<amrex::StateData,_std::allocator<amrex::StateData>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->state).super_vector<amrex::StateData,_std::allocator<amrex::StateData>_>.
  super__Vector_base<amrex::StateData,_std::allocator<amrex::StateData>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->fine_ratio).vect[1] = 0;
  (this->fine_ratio).vect[2] = 0;
  (this->state).super_vector<amrex::StateData,_std::allocator<amrex::StateData>_>.
  super__Vector_base<amrex::StateData,_std::allocator<amrex::StateData>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->crse_ratio).vect[0] = 0;
  (this->crse_ratio).vect[1] = 0;
  *(undefined8 *)((this->crse_ratio).vect + 2) = 0;
  local_98 = dm;
  BoxArray::BoxArray(local_48);
  (this->m_AreaToTag).smallend.vect[0] = 1;
  (this->m_AreaToTag).smallend.vect[1] = 1;
  (this->m_AreaToTag).smallend.vect[2] = 1;
  (this->m_AreaToTag).bigend.vect[0] = 0;
  (this->m_AreaToTag).bigend.vect[1] = 0;
  *(undefined8 *)((this->m_AreaToTag).bigend.vect + 2) = 0;
  (this->m_factory)._M_t.
  super___uniq_ptr_impl<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
  .super__Head_base<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_false>._M_head_impl =
       (FabFactory<amrex::FArrayBox> *)0x0;
  pBVar21 = (BoxArray *)&this->field_0x220;
  lVar23 = 0;
  local_170 = this;
  do {
    BoxArray::BoxArray(pBVar21);
    lVar23 = lVar23 + -0x68;
    pBVar21 = pBVar21 + 1;
  } while (lVar23 != -0x138);
  local_50 = &this->nodal_grids;
  BoxArray::BoxArray(local_50);
  this->level = lev;
  this->parent = papa;
  this->levelDirectoryCreated = false;
  (this->fine_ratio).vect[0] = 1;
  (this->fine_ratio).vect[1] = 1;
  (this->fine_ratio).vect[0] = -1;
  piVar1 = (this->fine_ratio).vect + 1;
  *piVar1 = -*piVar1;
  (this->fine_ratio).vect[2] = -1;
  (this->crse_ratio).vect[0] = 1;
  (this->crse_ratio).vect[1] = 1;
  (this->crse_ratio).vect[0] = -1;
  piVar1 = (this->crse_ratio).vect + 1;
  *piVar1 = -*piVar1;
  (this->crse_ratio).vect[2] = -1;
  if (0 < lev) {
    pIVar4 = (papa->super_AmrCore).super_AmrMesh.super_AmrInfo.ref_ratio.
             super_vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
             super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>._M_impl.
             super__Vector_impl_data._M_start;
    iVar10 = pIVar4[(ulong)(uint)lev - 1].vect[2];
    *(undefined8 *)(this->crse_ratio).vect = *(undefined8 *)pIVar4[(ulong)(uint)lev - 1].vect;
    (this->crse_ratio).vect[2] = iVar10;
  }
  local_a0 = (long)lev;
  if (lev < (papa->super_AmrCore).super_AmrMesh.super_AmrInfo.max_level) {
    pIVar4 = (papa->super_AmrCore).super_AmrMesh.super_AmrInfo.ref_ratio.
             super_vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
             super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>._M_impl.
             super__Vector_impl_data._M_start;
    iVar10 = pIVar4[local_a0].vect[2];
    *(undefined8 *)(this->fine_ratio).vect = *(undefined8 *)pIVar4[local_a0].vect;
    (this->fine_ratio).vect[2] = iVar10;
  }
  iVar10 = DescriptorList::size((DescriptorList *)desc_lst);
  std::vector<amrex::StateData,_std::allocator<amrex::StateData>_>::resize
            (&local_b0->super_vector<amrex::StateData,_std::allocator<amrex::StateData>_>,
             (long)iVar10);
  pIVar13 = EB2::TopIndexSpaceIfPresent();
  if (pIVar13 == (IndexSpace *)0x0) {
    pFVar14 = (FabFactory<amrex::FArrayBox> *)operator_new(8);
    pFVar14->_vptr_FabFactory = (_func_int **)&PTR__FabFactory_0074e8d0;
    pFVar5 = (this->m_factory)._M_t.
             super___uniq_ptr_impl<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
             .super__Head_base<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_false>._M_head_impl;
    (this->m_factory)._M_t.
    super___uniq_ptr_impl<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
    .super__Head_base<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_false>._M_head_impl = pFVar14;
    if (pFVar5 != (FabFactory<amrex::FArrayBox> *)0x0) {
      (*pFVar5->_vptr_FabFactory[1])();
    }
  }
  else {
    local_110 = (long *)CONCAT44(m_eb_volume_grow_cells,m_eb_basic_grow_cells);
    local_108 = CONCAT44(local_108._4_4_,m_eb_full_grow_cells);
    __l._M_len = 3;
    __l._M_array = (iterator)&local_110;
    std::vector<int,_std::allocator<int>_>::vector(&local_190,__l,(allocator_type *)&local_160);
    makeEBFabFactory((amrex *)local_130,local_168,local_138,local_98,
                     (Vector<int,_std::allocator<int>_> *)&local_190,m_eb_support_level);
    _Var9._M_head_impl = local_130[0]._M_head_impl;
    local_130[0]._M_head_impl = (FabFactory<amrex::FArrayBox> *)0x0;
    pFVar5 = (this->m_factory)._M_t.
             super___uniq_ptr_impl<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
             .super__Head_base<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_false>._M_head_impl;
    (this->m_factory)._M_t.
    super___uniq_ptr_impl<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
    .super__Head_base<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_false>._M_head_impl =
         _Var9._M_head_impl;
    if (pFVar5 != (FabFactory<amrex::FArrayBox> *)0x0) {
      (*pFVar5->_vptr_FabFactory[1])();
    }
    if (local_130[0]._M_head_impl != (FabFactory<amrex::FArrayBox> *)0x0) {
      (*(local_130[0]._M_head_impl)->_vptr_FabFactory[1])();
    }
    local_130[0]._M_head_impl = (FabFactory<amrex::FArrayBox> *)0x0;
    if ((pointer *)
        local_190.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer *)0x0) {
      operator_delete(local_190.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_190.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_190.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
  }
  pSVar6 = (this->state).super_vector<amrex::StateData,_std::allocator<amrex::StateData>_>.
           super__Vector_base<amrex::StateData,_std::allocator<amrex::StateData>_>._M_impl.
           super__Vector_impl_data._M_finish;
  pSVar7 = (this->state).super_vector<amrex::StateData,_std::allocator<amrex::StateData>_>.
           super__Vector_base<amrex::StateData,_std::allocator<amrex::StateData>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (pSVar6 != pSVar7 && -1 < (long)pSVar6 - (long)pSVar7) {
    uVar27 = -lev;
    if (0 < lev) {
      uVar27 = lev;
    }
    local_138 = (BoxArray *)(ulong)((uint)lev >> 0x1f);
    local_40 = &(this->geom).domain;
    uVar26 = 0;
    local_168 = (Geometry *)CONCAT44(local_168._4_4_,uVar27);
    do {
      pBVar21 = local_138;
      uVar24 = 1;
      if (9 < uVar27) {
        uVar25 = 4;
        do {
          uVar24 = uVar25;
          if (uVar27 < 100) {
            uVar24 = uVar24 - 2;
            goto LAB_004f0e56;
          }
          if (uVar27 < 1000) {
            uVar24 = uVar24 - 1;
            goto LAB_004f0e56;
          }
          if (uVar27 < 10000) goto LAB_004f0e56;
          bVar8 = 99999 < uVar27;
          uVar25 = uVar24 + 4;
          uVar27 = uVar27 / 10000;
        } while (bVar8);
        uVar24 = uVar24 + 1;
      }
LAB_004f0e56:
      local_190.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)&local_190.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_end_of_storage;
      std::__cxx11::string::_M_construct((ulong)&local_190,(char)local_138 + (char)uVar24);
      std::__detail::__to_chars_10_impl<unsigned_int>
                ((char *)((long)local_190.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start + (long)pBVar21),uVar24,
                 (uint)local_168);
      plVar15 = (long *)std::__cxx11::string::replace((ulong)&local_190,0,(char *)0x0,0x6b7cb8);
      local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
      psVar17 = (size_type *)(plVar15 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar15 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar17) {
        local_70.field_2._M_allocated_capacity = *psVar17;
        local_70.field_2._8_8_ = plVar15[3];
      }
      else {
        local_70.field_2._M_allocated_capacity = *psVar17;
        local_70._M_dataplus._M_p = (pointer)*plVar15;
      }
      uVar27 = (uint)local_168;
      local_70._M_string_length = plVar15[1];
      *plVar15 = (long)psVar17;
      plVar15[1] = 0;
      *(undefined1 *)(plVar15 + 2) = 0;
      FabArrayBase::RegionTag::RegionTag(&local_139,&local_70);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
      }
      if ((pointer *)
          local_190.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start !=
          &local_190.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_end_of_storage) {
        operator_delete(local_190.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_190.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage + 1);
      }
      uVar24 = 1;
      uVar25 = (uint)uVar26;
      if (9 < uVar26) {
        uVar12 = 4;
        uVar18 = uVar26;
        do {
          uVar24 = uVar12;
          uVar11 = (uint)uVar18;
          if (uVar11 < 100) {
            uVar24 = uVar24 - 2;
            goto LAB_004f0fab;
          }
          if (uVar11 < 1000) {
            uVar24 = uVar24 - 1;
            goto LAB_004f0fab;
          }
          if (uVar11 < 10000) goto LAB_004f0fab;
          uVar18 = (uVar18 & 0xffffffff) / 10000;
          uVar12 = uVar24 + 4;
        } while (99999 < uVar11);
        uVar24 = uVar24 + 1;
      }
LAB_004f0fab:
      local_130[0]._M_head_impl = local_120;
      std::__cxx11::string::_M_construct((ulong)local_130,(char)uVar24);
      std::__detail::__to_chars_10_impl<unsigned_int>
                ((char *)local_130[0]._M_head_impl,uVar24,uVar25);
      plVar15 = (long *)std::__cxx11::string::replace((ulong)local_130,0,(char *)0x0,0x6b7cc9);
      plVar19 = plVar15 + 2;
      if ((long *)*plVar15 == plVar19) {
        local_100 = *plVar19;
        lStack_f8 = plVar15[3];
        local_110 = &local_100;
      }
      else {
        local_100 = *plVar19;
        local_110 = (long *)*plVar15;
      }
      local_108 = plVar15[1];
      *plVar15 = (long)plVar19;
      plVar15[1] = 0;
      *(undefined1 *)(plVar15 + 2) = 0;
      plVar15 = (long *)std::__cxx11::string::append((char *)&local_110);
      pBVar21 = local_138;
      puVar20 = (ulong *)(plVar15 + 2);
      if ((pointer *)*plVar15 == (pointer *)puVar20) {
        local_190.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage = (pointer)*puVar20;
        lStack_178 = plVar15[3];
        local_190.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start = (pointer)&local_190.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage;
      }
      else {
        local_190.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage = (pointer)*puVar20;
        local_190.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start = (pointer)*plVar15;
      }
      local_190.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)plVar15[1];
      *plVar15 = (long)puVar20;
      plVar15[1] = 0;
      *(undefined1 *)(plVar15 + 2) = 0;
      uVar24 = 1;
      if (9 < uVar27) {
        uVar12 = uVar27;
        uVar11 = 4;
        do {
          uVar24 = uVar11;
          if (uVar12 < 100) {
            uVar24 = uVar24 - 2;
            goto LAB_004f10ec;
          }
          if (uVar12 < 1000) {
            uVar24 = uVar24 - 1;
            goto LAB_004f10ec;
          }
          if (uVar12 < 10000) goto LAB_004f10ec;
          bVar8 = 99999 < uVar12;
          uVar12 = uVar12 / 10000;
          uVar11 = uVar24 + 4;
        } while (bVar8);
        uVar24 = uVar24 + 1;
      }
LAB_004f10ec:
      local_160 = local_150;
      std::__cxx11::string::_M_construct((ulong)&local_160,(char)local_138 + (char)uVar24);
      std::__detail::__to_chars_10_impl<unsigned_int>
                ((char *)((long)local_160 + (long)pBVar21),uVar24,uVar27);
      ppiVar2 = &local_190.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage;
      piVar22 = (pointer)0xf;
      if ((pointer *)
          local_190.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start != ppiVar2) {
        piVar22 = local_190.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage;
      }
      if (piVar22 < (pointer)(local_158 +
                             (long)local_190.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_finish)) {
        piVar22 = (pointer)0xf;
        if (local_160 != local_150) {
          piVar22 = local_150[0];
        }
        if (piVar22 < (pointer)(local_158 +
                               (long)local_190.super__Vector_base<int,_std::allocator<int>_>._M_impl
                                     .super__Vector_impl_data._M_finish)) goto LAB_004f1170;
        puVar16 = (undefined8 *)
                  std::__cxx11::string::replace
                            ((ulong)&local_160,0,(char *)0x0,
                             (ulong)local_190.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                    super__Vector_impl_data._M_start);
      }
      else {
LAB_004f1170:
        puVar16 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_190,(ulong)local_160)
        ;
      }
      local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
      psVar17 = puVar16 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar16 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar17) {
        local_d0.field_2._M_allocated_capacity = *psVar17;
        local_d0.field_2._8_8_ = puVar16[3];
      }
      else {
        local_d0.field_2._M_allocated_capacity = *psVar17;
        local_d0._M_dataplus._M_p = (pointer)*puVar16;
      }
      local_d0._M_string_length = puVar16[1];
      *puVar16 = psVar17;
      puVar16[1] = 0;
      *(undefined1 *)psVar17 = 0;
      FabArrayBase::RegionTag::RegionTag(&local_13a,&local_d0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
        operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
      }
      if (local_160 != local_150) {
        operator_delete(local_160,(long)local_150[0] + 1);
      }
      if ((pointer *)
          local_190.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start != ppiVar2) {
        operator_delete(local_190.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_190.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage + 1);
      }
      if (local_110 != &local_100) {
        operator_delete(local_110,local_100 + 1);
      }
      if (local_130[0]._M_head_impl != local_120) {
        operator_delete(local_130[0]._M_head_impl,(long)local_120[0]._vptr_FabFactory + 1);
      }
      uVar24 = 1;
      if (9 < uVar26) {
        uVar12 = 4;
        uVar18 = uVar26;
        do {
          uVar24 = uVar12;
          uVar11 = (uint)uVar18;
          if (uVar11 < 100) {
            uVar24 = uVar24 - 2;
            goto LAB_004f12d7;
          }
          if (uVar11 < 1000) {
            uVar24 = uVar24 - 1;
            goto LAB_004f12d7;
          }
          if (uVar11 < 10000) goto LAB_004f12d7;
          uVar18 = (uVar18 & 0xffffffff) / 10000;
          uVar12 = uVar24 + 4;
        } while (99999 < uVar11);
        uVar24 = uVar24 + 1;
      }
LAB_004f12d7:
      local_130[0]._M_head_impl = local_120;
      std::__cxx11::string::_M_construct((ulong)local_130,(char)uVar24);
      std::__detail::__to_chars_10_impl<unsigned_int>
                ((char *)local_130[0]._M_head_impl,uVar24,uVar25);
      plVar15 = (long *)std::__cxx11::string::replace((ulong)local_130,0,(char *)0x0,0x6b7cc9);
      plVar19 = plVar15 + 2;
      if ((long *)*plVar15 == plVar19) {
        local_100 = *plVar19;
        lStack_f8 = plVar15[3];
        local_110 = &local_100;
      }
      else {
        local_100 = *plVar19;
        local_110 = (long *)*plVar15;
      }
      local_108 = plVar15[1];
      *plVar15 = (long)plVar19;
      plVar15[1] = 0;
      *(undefined1 *)(plVar15 + 2) = 0;
      plVar15 = (long *)std::__cxx11::string::append((char *)&local_110);
      pBVar21 = local_138;
      puVar20 = (ulong *)(plVar15 + 2);
      if ((pointer *)*plVar15 == (pointer *)puVar20) {
        local_190.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage = (pointer)*puVar20;
        lStack_178 = plVar15[3];
        local_190.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start = (pointer)&local_190.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage;
      }
      else {
        local_190.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage = (pointer)*puVar20;
        local_190.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start = (pointer)*plVar15;
      }
      local_190.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)plVar15[1];
      *plVar15 = (long)puVar20;
      plVar15[1] = 0;
      *(undefined1 *)(plVar15 + 2) = 0;
      uVar24 = 1;
      if (9 < uVar27) {
        uVar12 = uVar27;
        uVar11 = 4;
        do {
          uVar24 = uVar11;
          if (uVar12 < 100) {
            uVar24 = uVar24 - 2;
            goto LAB_004f141b;
          }
          if (uVar12 < 1000) {
            uVar24 = uVar24 - 1;
            goto LAB_004f141b;
          }
          if (uVar12 < 10000) goto LAB_004f141b;
          bVar8 = 99999 < uVar12;
          uVar12 = uVar12 / 10000;
          uVar11 = uVar24 + 4;
        } while (bVar8);
        uVar24 = uVar24 + 1;
      }
LAB_004f141b:
      local_160 = local_150;
      std::__cxx11::string::_M_construct((ulong)&local_160,(char)local_138 + (char)uVar24);
      std::__detail::__to_chars_10_impl<unsigned_int>
                ((char *)((long)local_160 + (long)pBVar21),uVar24,uVar27);
      ppiVar2 = &local_190.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage;
      piVar22 = (pointer)0xf;
      if ((pointer *)
          local_190.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start != ppiVar2) {
        piVar22 = local_190.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage;
      }
      if (piVar22 < (pointer)(local_158 +
                             (long)local_190.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_finish)) {
        piVar22 = (pointer)0xf;
        if (local_160 != local_150) {
          piVar22 = local_150[0];
        }
        if (piVar22 < (pointer)(local_158 +
                               (long)local_190.super__Vector_base<int,_std::allocator<int>_>._M_impl
                                     .super__Vector_impl_data._M_finish)) goto LAB_004f149f;
        puVar16 = (undefined8 *)
                  std::__cxx11::string::replace
                            ((ulong)&local_160,0,(char *)0x0,
                             (ulong)local_190.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                    super__Vector_impl_data._M_start);
      }
      else {
LAB_004f149f:
        puVar16 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_190,(ulong)local_160)
        ;
      }
      local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
      psVar17 = puVar16 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar16 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar17) {
        local_f0.field_2._M_allocated_capacity = *psVar17;
        local_f0.field_2._8_8_ = puVar16[3];
      }
      else {
        local_f0.field_2._M_allocated_capacity = *psVar17;
        local_f0._M_dataplus._M_p = (pointer)*puVar16;
      }
      local_f0._M_string_length = puVar16[1];
      *puVar16 = psVar17;
      puVar16[1] = 0;
      *(undefined1 *)psVar17 = 0;
      FabArrayBase::RegionTag::RegionTag(&local_13b,&local_f0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
        operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
      }
      if (local_160 != local_150) {
        operator_delete(local_160,(long)local_150[0] + 1);
      }
      if ((pointer *)
          local_190.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start != ppiVar2) {
        operator_delete(local_190.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_190.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage + 1);
      }
      if (local_110 != &local_100) {
        operator_delete(local_110,local_100 + 1);
      }
      if (local_130[0]._M_head_impl != local_120) {
        operator_delete(local_130[0]._M_head_impl,(long)local_120[0]._vptr_FabFactory + 1);
      }
      pBVar21 = local_138;
      uVar24 = 1;
      if (9 < uVar27) {
        uVar12 = 4;
        do {
          uVar24 = uVar12;
          if (uVar27 < 100) {
            uVar24 = uVar24 - 2;
            goto LAB_004f160c;
          }
          if (uVar27 < 1000) {
            uVar24 = uVar24 - 1;
            goto LAB_004f160c;
          }
          if (uVar27 < 10000) goto LAB_004f160c;
          bVar8 = 99999 < uVar27;
          uVar27 = uVar27 / 10000;
          uVar12 = uVar24 + 4;
        } while (bVar8);
        uVar24 = uVar24 + 1;
      }
LAB_004f160c:
      local_190.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)&local_190.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_end_of_storage;
      std::__cxx11::string::_M_construct((ulong)&local_190,(char)local_138 + (char)uVar24);
      std::__detail::__to_chars_10_impl<unsigned_int>
                ((char *)((long)local_190.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start + (long)pBVar21),uVar24,
                 (uint)local_168);
      plVar15 = (long *)std::__cxx11::string::replace((ulong)&local_190,0,(char *)0x0,0x6b7ce0);
      this = local_170;
      local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
      psVar17 = (size_type *)(plVar15 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar15 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar17) {
        local_90.field_2._M_allocated_capacity = *psVar17;
        local_90.field_2._8_8_ = plVar15[3];
      }
      else {
        local_90.field_2._M_allocated_capacity = *psVar17;
        local_90._M_dataplus._M_p = (pointer)*plVar15;
      }
      uVar27 = (uint)local_168;
      local_90._M_string_length = plVar15[1];
      *plVar15 = (long)psVar17;
      plVar15[1] = 0;
      *(undefined1 *)(plVar15 + 2) = 0;
      FabArrayBase::RegionTag::RegionTag((RegionTag *)&local_110,&local_90);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != &local_90.field_2) {
        operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
      }
      if ((pointer *)
          local_190.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start !=
          &local_190.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_end_of_storage) {
        operator_delete(local_190.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_190.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage + 1);
      }
      pSVar6 = (this->state).super_vector<amrex::StateData,_std::allocator<amrex::StateData>_>.
               super__Vector_base<amrex::StateData,_std::allocator<amrex::StateData>_>._M_impl.
               super__Vector_impl_data._M_start;
      d = DescriptorList::operator[]((DescriptorList *)desc_lst,uVar25);
      StateData::define(pSVar6 + uVar26,local_40,local_a8,local_98,d,local_38,
                        (this->parent->dt_level).super_vector<double,_std::allocator<double>_>.
                        super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start[local_a0],
                        (this->m_factory)._M_t.
                        super___uniq_ptr_impl<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
                        .super__Head_base<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_false>.
                        _M_head_impl);
      FabArrayBase::popRegionTag();
      FabArrayBase::popRegionTag();
      FabArrayBase::popRegionTag();
      FabArrayBase::popRegionTag();
      uVar26 = uVar26 + 1;
      lVar23 = ((long)(this->state).
                      super_vector<amrex::StateData,_std::allocator<amrex::StateData>_>.
                      super__Vector_base<amrex::StateData,_std::allocator<amrex::StateData>_>.
                      _M_impl.super__Vector_impl_data._M_finish -
                (long)(this->state).
                      super_vector<amrex::StateData,_std::allocator<amrex::StateData>_>.
                      super__Vector_base<amrex::StateData,_std::allocator<amrex::StateData>_>.
                      _M_impl.super__Vector_impl_data._M_start >> 5) * 0x6db6db6db6db6db7;
    } while (lVar23 - uVar26 != 0 && (long)uVar26 <= lVar23);
  }
  if ((this->parent->super_AmrCore).super_AmrMesh.super_AmrInfo.use_fixed_coarse_grids != false) {
    constructAreaNotToTag(this);
  }
  this->post_step_regrid = 0;
  return;
}

Assistant:

AmrLevel::AmrLevel (Amr&            papa,
                    int             lev,
                    const Geometry& level_geom,
                    const BoxArray& ba,
                    const DistributionMapping& dm,
                    Real            time)
    :
    geom(level_geom),
    grids(ba),
    dmap(dm)
{
    BL_PROFILE("AmrLevel::AmrLevel(dm)");
    level  = lev;
    parent = &papa;
    levelDirectoryCreated = false;

    fine_ratio = IntVect::TheUnitVector(); fine_ratio.scale(-1);
    crse_ratio = IntVect::TheUnitVector(); crse_ratio.scale(-1);

    if (level > 0)
    {
        crse_ratio = parent->refRatio(level-1);
    }
    if (level < parent->maxLevel())
    {
        fine_ratio = parent->refRatio(level);
    }

    state.resize(desc_lst.size());

#ifdef AMREX_USE_EB
    if (EB2::TopIndexSpaceIfPresent()) {
        m_factory = makeEBFabFactory(geom, ba, dm,
                                     {m_eb_basic_grow_cells,
                                      m_eb_volume_grow_cells,
                                      m_eb_full_grow_cells},
                                     m_eb_support_level);
    } else
#endif
    {
        m_factory = std::make_unique<FArrayBoxFactory>();
    }

    // Note that this creates a distribution map associated with grids.
    for (int i = 0; i < state.size(); i++)
    {
        MultiFab::RegionTag statedata_tag("StateData_Level_" + std::to_string(lev));
        MultiFab::RegionTag statedata_index_tag("StateData_" + std::to_string(i) + "_Level_" + std::to_string(lev));
        MultiFab::RegionTag statedata_index_new_tag("StateData_" + std::to_string(i) + "_New_Level_" + std::to_string(lev));
        MultiFab::RegionTag level_tag("AmrLevel_Level_" + std::to_string(lev));
        state[i].define(geom.Domain(),
                        grids,
                        dm,
                        desc_lst[i],
                        time,
                        parent->dtLevel(lev),
                        *m_factory);
    }

    if (parent->useFixedCoarseGrids()) constructAreaNotToTag();

    post_step_regrid = 0;

    finishConstructor();
}